

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall
cmDebugger_impl::OnWatchCallback
          (cmDebugger_impl *this,string *variable,int access_type,char *newValue)

{
  cmDebuggerListener *pcVar1;
  bool bVar2;
  t tVar3;
  allocator local_69;
  string local_68 [32];
  reference local_48;
  cmDebuggerListener **l;
  iterator __end2;
  iterator __begin2;
  set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  *__range2;
  char *newValue_local;
  int access_type_local;
  string *variable_local;
  cmDebugger_impl *this_local;
  
  tVar3 = std::atomic::operator_cast_to_t((atomic *)&this->state);
  if (tVar3 != Paused) {
    __end2 = std::
             set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
             ::begin(&this->listeners);
    l = (cmDebuggerListener **)
        std::
        set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
        ::end(&this->listeners);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&l);
      if (!bVar2) break;
      local_48 = std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator*(&__end2);
      pcVar1 = *local_48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,newValue,&local_69);
      (*pcVar1->_vptr_cmDebuggerListener[4])(pcVar1,variable,(ulong)(uint)access_type,local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator++(&__end2);
    }
    PauseExecution(this);
  }
  return;
}

Assistant:

void OnWatchCallback(const std::string& variable, int access_type,
                       const char* newValue)
  {
    // It's possible that this is triggered by the user setting / reading the
    // variable via the debugger;
    // in which case we can't pause and shouldn't notify listeners.
    if (state != State::Paused) {
      for (auto& l : listeners) {
        l->OnWatchpoint(variable, access_type, newValue);
      }
      PauseExecution();
    }
  }